

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  
LAB_00316eba:
  do {
    while( true ) {
      pbVar4 = (byte *)ptr;
      uVar5 = (long)end - (long)pbVar4;
      if ((long)uVar5 < 2) {
        return -1;
      }
      bVar1 = *pbVar4;
      if (3 < bVar1 - 0xd8) break;
switchD_00316f27_caseD_7:
      if (uVar5 < 4) {
        return -2;
      }
      ptr = (char *)(pbVar4 + 4);
    }
    if (bVar1 != 0) {
      if (bVar1 == 0xff) {
        if (pbVar4[1] < 0xfe) goto switchD_00316f27_caseD_2;
      }
      else if (3 < bVar1 - 0xdc) {
switchD_00316f27_caseD_2:
        ptr = (char *)(pbVar4 + 2);
        goto LAB_00316eba;
      }
switchD_00316f27_caseD_0:
      *nextTokPtr = (char *)pbVar4;
      goto LAB_00316f55;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar4[1]);
    switch(bVar1) {
    case 0:
    case 1:
    case 8:
      goto switchD_00316f27_caseD_0;
    default:
      goto switchD_00316f27_caseD_2;
    case 6:
      if (uVar5 == 2) {
        return -2;
      }
      ptr = (char *)(pbVar4 + 3);
      break;
    case 7:
      goto switchD_00316f27_caseD_7;
    case 0xc:
    case 0xd:
      ptr = (char *)(pbVar4 + 2);
      if ((uint)bVar1 == open) {
        if ((long)end - (long)ptr < 2) {
          iVar2 = -0x1b;
        }
        else {
          *nextTokPtr = ptr;
          if (((*ptr == 0) &&
              (uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar4[3]), uVar3 < 0x1f)) &&
             ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
            iVar2 = 0x1b;
          }
          else {
LAB_00316f55:
            iVar2 = 0;
          }
        }
        return iVar2;
      }
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}